

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

binarydata * __thiscall
NetworkDataType::
serializedata<unsigned_char_const,unsigned_char_const,unsigned_short_const,unsigned_short_const,unsigned_short_const,unsigned_short_const,unsigned_short_const,unsigned_char_const,unsigned_short_const,unsigned_char_const,unsigned_short_const,unsigned_short_const,unsigned_short_const,unsigned_short_const>
          (binarydata *__return_storage_ptr__,NetworkDataType *this,uchar *args,uchar *args_1,
          unsigned_short *args_2,unsigned_short *args_3,unsigned_short *args_4,
          unsigned_short *args_5,unsigned_short *args_6,uchar *args_7,unsigned_short *args_8,
          uchar *args_9,unsigned_short *args_10,unsigned_short *args_11,unsigned_short *args_12,
          unsigned_short *args_13)

{
  string local_2d8;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  local_2d8._M_dataplus._M_p._0_1_ =
       cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (&archive,(ostream *)&stream,(Options *)&local_2d8);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::
  process<unsigned_char_const&,unsigned_char_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_char_const&,unsigned_short_const&,unsigned_char_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&>
            ((OutputArchive<cereal::PortableBinaryOutputArchive,1u> *)
             archive.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.self,(uchar *)this
             ,args,(unsigned_short *)args_1,args_2,args_3,args_4,args_5,(uchar *)args_6,
             (unsigned_short *)args_7,(uchar *)args_8,(unsigned_short *)args_9,args_10,args_11,
             args_12);
  std::__cxx11::stringbuf::str();
  binarydata::binarydata(__return_storage_ptr__,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,_1U>::~OutputArchive
            (&archive.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }